

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

string * tinyusdz::escapeSingleQuote
                   (string *__return_storage_ptr__,string *str,bool is_double_quote)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_30;
  size_t i_1;
  size_t i;
  bool is_double_quote_local;
  string *str_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (is_double_quote) {
    for (i_1 = 0; uVar1 = ::std::__cxx11::string::size(), i_1 < uVar1; i_1 = i_1 + 1) {
      pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str);
      if (*pcVar2 == '\"') {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
      }
      else {
        pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      }
    }
  }
  else {
    for (local_30 = 0; uVar1 = ::std::__cxx11::string::size(), local_30 < uVar1;
        local_30 = local_30 + 1) {
      pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str);
      if (*pcVar2 == '\'') {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\'");
      }
      else {
        pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)str);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escapeSingleQuote(const std::string &str,
                              const bool is_double_quote) {
  std::string s;

  if (is_double_quote) {
    for (size_t i = 0; i < str.size(); i++) {
      if (str[i] == '"') {
        s += "\\\"";
      } else {
        s += str[i];
      }
    }
  } else {
    for (size_t i = 0; i < str.size(); i++) {
      if (str[i] == '\'') {
        s += "\\'";
      } else {
        s += str[i];
      }
    }
  }

  return s;
}